

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  pointer *ppbVar1;
  string *this_00;
  MUFile *pMVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  char *pcVar5;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *puVar6;
  iterator iVar7;
  iterator iVar8;
  reference ppMVar9;
  string *value;
  iterator __first;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  allocator<char> local_8d1;
  undefined1 local_8d0 [8];
  string err;
  allocator<char> local_89a;
  allocator<char> local_899;
  string local_898;
  string local_878;
  allocator<char> local_852;
  allocator<char> local_851;
  string local_850;
  string local_830;
  string local_810;
  allocator<char> local_7ea;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  undefined1 local_7a8 [8];
  string flags_1;
  MUFile *muf_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  *__range2_3;
  pointer local_730;
  reference local_728;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair_1;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range2_2;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  sorted;
  size_type sourcesCount;
  string local_6c0;
  undefined1 local_6a0 [8];
  string path;
  undefined1 local_678 [4];
  uint ii;
  undefined1 local_658 [8];
  string basePath;
  string *hdr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  cmFilePathChecksum fpathCheckSum;
  string flags;
  MUFile *muf;
  iterator __end2;
  iterator __begin2;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  *__range2;
  pointer local_468;
  reference local_460;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair;
  iterator __end3;
  iterator __begin3;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range3;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  sortedHeaders;
  size_type headerCount;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourcesFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headersBuildPaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headersFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  cmMakefile *local_280;
  anon_class_8_1_ea5e79e8 MfDef;
  cmMakefile *makefile;
  undefined1 local_260 [8];
  InfoWriter ofs;
  cmQtAutoGenInitializer *this_local;
  
  ofs.Ofs_._576_8_ = this;
  InfoWriter::InfoWriter((InfoWriter *)local_260,&(this->AutogenTarget).InfoFile);
  bVar4 = InfoWriter::operator_cast_to_bool((InfoWriter *)local_260);
  if (bVar4) {
    local_280 = cmTarget::GetMakefile(this->Target->Target);
    MfDef.makefile = local_280;
    InfoWriter::Write((InfoWriter *)local_260,"# Meta\n");
    pcVar5 = "FALSE";
    if ((this->MultiConfig & 1U) != 0) {
      pcVar5 = "TRUE";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,pcVar5,&local_2a1);
    InfoWriter::Write((InfoWriter *)local_260,"AM_MULTI_CONFIG",&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    InfoWriter::Write((InfoWriter *)local_260,"AM_PARALLEL",&(this->AutogenTarget).Parallel);
    InfoWriter::Write((InfoWriter *)local_260,"AM_VERBOSITY",&this->Verbosity);
    InfoWriter::Write((InfoWriter *)local_260,"# Directories\n");
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&local_2c8,&local_280,"CMAKE_SOURCE_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_SOURCE_DIR",&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_(&local_2e8,&local_280,"CMAKE_BINARY_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_BINARY_DIR",&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              (&local_308,&local_280,"CMAKE_CURRENT_SOURCE_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_CURRENT_SOURCE_DIR",&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              (&local_328,&local_280,"CMAKE_CURRENT_BINARY_DIR");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_CURRENT_BINARY_DIR",&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
              ((string *)
               &headers.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_280,
               "CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
                      (string *)
                      &headers.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &headers.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InfoWriter::Write((InfoWriter *)local_260,"AM_BUILD_DIR",&(this->Dir).Build);
    InfoWriter::Write((InfoWriter *)local_260,"AM_INCLUDE_DIR",&(this->Dir).Include);
    InfoWriter::WriteConfig((InfoWriter *)local_260,"AM_INCLUDE_DIR",&(this->Dir).ConfigInclude);
    ppbVar1 = &headersFlags.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&headersBuildPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sourcesFlags.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&headerCount);
    sortedHeaders.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                  ::size(&(this->AutogenTarget).Headers);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)ppbVar1,
              (size_type)
              sortedHeaders.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&headersBuildPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (size_type)
              sortedHeaders.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::vector((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              *)&__range3);
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::reserve((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *)&__range3,
              (size_type)
              sortedHeaders.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar6 = &(this->AutogenTarget).Headers;
    __end3 = std::
             unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
             ::begin(puVar6);
    pair = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
            *)std::
              unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
              ::end(puVar6);
    while (bVar4 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                                *)&pair), bVar4) {
      local_460 = std::__detail::
                  _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
                  ::operator*(&__end3);
      local_468 = std::
                  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                  ::get(&local_460->second);
      std::
      vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
      ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                  *)&__range3,&local_468);
      std::__detail::
      _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
      ::operator++(&__end3);
    }
    iVar7 = std::
            vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ::begin((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     *)&__range3);
    iVar8 = std::
            vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ::end((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   *)&__range3);
    std::
    sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>
              (iVar7._M_current,iVar8._M_current);
    __end2 = std::
             vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
             ::begin((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                      *)&__range3);
    muf = (MUFile *)
          std::
          vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
          ::end((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 *)&__range3);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
                                       *)&muf), bVar4) {
      ppMVar9 = __gnu_cxx::
                __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
                ::operator*(&__end2);
      pMVar2 = *ppMVar9;
      if (((pMVar2->Generated & 1U) == 0) || ((this->CMP0071Accept & 1U) != 0)) {
        if ((pMVar2->SkipMoc & 1U) != 0) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count,&pMVar2->RealPath);
        }
        if ((pMVar2->SkipUic & 1U) != 0) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&headerCount,&pMVar2->RealPath);
        }
        if (((pMVar2->MocIt & 1U) != 0) || ((pMVar2->UicIt & 1U) != 0)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &headersFlags.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&pMVar2->RealPath);
          this_00 = (string *)(fpathCheckSum.parentDirs._M_elems[3].second.field_2._M_local_buf + 8)
          ;
          std::__cxx11::string::string(this_00);
          std::__cxx11::string::operator+=(this_00,(~pMVar2->MocIt & 1U) << 5 | 0x4d);
          std::__cxx11::string::operator+=
                    ((string *)
                     (fpathCheckSum.parentDirs._M_elems[3].second.field_2._M_local_buf + 8),
                     (~pMVar2->UicIt & 1U) << 5 | 0x55);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &headersBuildPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fpathCheckSum.parentDirs._M_elems[3].second.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)
                     (fpathCheckSum.parentDirs._M_elems[3].second.field_2._M_local_buf + 8));
        }
      }
      __gnu_cxx::
      __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::~vector((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *)&__range3);
    cmFilePathChecksum::cmFilePathChecksum
              ((cmFilePathChecksum *)&emitted._M_h._M_single_bucket,MfDef.makefile);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2_1);
    ppbVar1 = &headersFlags.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar1);
    hdr = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&hdr), bVar4) {
      basePath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2_1);
      cmFilePathChecksum::getPart
                ((string *)local_658,(cmFilePathChecksum *)&emitted._M_h._M_single_bucket,
                 (string *)basePath.field_2._8_8_,10);
      std::__cxx11::string::operator+=((string *)local_658,"/moc_");
      cmsys::SystemTools::GetFilenameWithoutLastExtension
                ((string *)local_678,(string *)basePath.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_658,(string *)local_678);
      std::__cxx11::string::~string((string *)local_678);
      for (path.field_2._12_4_ = 1; path.field_2._12_4_ != 0x400;
          path.field_2._12_4_ = path.field_2._12_4_ + 1) {
        std::__cxx11::string::string((string *)local_6a0,(string *)local_658);
        if (1 < (uint)path.field_2._12_4_) {
          std::__cxx11::string::operator+=((string *)local_6a0,'_');
          std::__cxx11::to_string(&local_6c0,path.field_2._12_4_);
          std::__cxx11::string::operator+=((string *)local_6a0,(string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6c0);
        }
        std::__cxx11::string::operator+=((string *)local_6a0,".cpp");
        pVar10 = std::
                 unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::emplace<std::__cxx11::string&>
                           ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&__range2_1,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_6a0);
        bVar4 = ((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
        if (bVar4) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &sources.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0)
          ;
        }
        std::__cxx11::string::~string((string *)local_6a0);
        if (bVar4) break;
      }
      std::__cxx11::string::~string((string *)local_658);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2_1);
    cmFilePathChecksum::~cmFilePathChecksum((cmFilePathChecksum *)&emitted._M_h._M_single_bucket);
    sorted.
    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                  ::size(&(this->AutogenTarget).Sources);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourcesFlags.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (size_type)
              sorted.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count,
              (size_type)
              sorted.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::vector((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              *)&__range2_2);
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::reserve((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *)&__range2_2,
              (size_type)
              sorted.
              super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar6 = &(this->AutogenTarget).Sources;
    __end2_2 = std::
               unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
               ::begin(puVar6);
    pair_1 = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
              *)std::
                unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
                ::end(puVar6);
    while (bVar4 = std::__detail::operator!=
                             (&__end2_2.
                               super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                                *)&pair_1), bVar4) {
      local_728 = std::__detail::
                  _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
                  ::operator*(&__end2_2);
      local_730 = std::
                  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                  ::get(&local_728->second);
      std::
      vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
      ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                  *)&__range2_2,&local_730);
      std::__detail::
      _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
      ::operator++(&__end2_2);
    }
    iVar7 = std::
            vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ::begin((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                     *)&__range2_2);
    iVar8 = std::
            vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ::end((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   *)&__range2_2);
    std::
    sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>
              (iVar7._M_current,iVar8._M_current);
    __end2_3 = std::
               vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ::begin((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                        *)&__range2_2);
    muf_1 = (MUFile *)
            std::
            vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ::end((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   *)&__range2_2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
                               *)&muf_1), bVar4) {
      ppMVar9 = __gnu_cxx::
                __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
                ::operator*(&__end2_3);
      pMVar2 = *ppMVar9;
      if (((pMVar2->Generated & 1U) == 0) || ((this->CMP0071Accept & 1U) != 0)) {
        if ((pMVar2->SkipMoc & 1U) != 0) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count,&pMVar2->RealPath);
        }
        if ((pMVar2->SkipUic & 1U) != 0) {
          pVar11 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&headerCount,&pMVar2->RealPath);
          flags_1.field_2._8_8_ = pVar11.first._M_node;
        }
        if (((pMVar2->MocIt & 1U) != 0) || ((pMVar2->UicIt & 1U) != 0)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &sourcesFlags.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&pMVar2->RealPath);
          std::__cxx11::string::string((string *)local_7a8);
          std::__cxx11::string::operator+=((string *)local_7a8,(~pMVar2->MocIt & 1U) << 5 | 0x4d);
          std::__cxx11::string::operator+=((string *)local_7a8,(~pMVar2->UicIt & 1U) << 5 | 0x55);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8)
          ;
          std::__cxx11::string::~string((string *)local_7a8);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
      ::operator++(&__end2_3);
    }
    std::
    vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
    ::~vector((vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *)&__range2_2);
    InfoWriter::Write((InfoWriter *)local_260,"# Qt\n");
    InfoWriter::WriteUInt((InfoWriter *)local_260,"AM_QT_VERSION_MAJOR",(this->QtVersion).Major);
    InfoWriter::Write((InfoWriter *)local_260,"AM_QT_MOC_EXECUTABLE",
                      &(this->Moc).super_GenVarsT.Executable);
    InfoWriter::Write((InfoWriter *)local_260,"AM_QT_UIC_EXECUTABLE",
                      &(this->Uic).super_GenVarsT.Executable);
    InfoWriter::Write((InfoWriter *)local_260,"# Files\n");
    value = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    InfoWriter::Write((InfoWriter *)local_260,"AM_CMAKE_EXECUTABLE",value);
    InfoWriter::Write((InfoWriter *)local_260,"AM_SETTINGS_FILE",&(this->AutogenTarget).SettingsFile
                     );
    InfoWriter::WriteConfig
              ((InfoWriter *)local_260,"AM_SETTINGS_FILE",&(this->AutogenTarget).ConfigSettingsFile)
    ;
    InfoWriter::Write((InfoWriter *)local_260,"AM_PARSE_CACHE_FILE",
                      &(this->AutogenTarget).ParseCacheFile);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_HEADERS",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&headersFlags.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_HEADERS_FLAGS",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&headersBuildPaths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_HEADERS_BUILD_PATHS",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_SOURCES",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourcesFlags.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    InfoWriter::WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)local_260,"AM_SOURCES_FLAGS",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      InfoWriter::Write((InfoWriter *)local_260,"# MOC settings\n");
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_DEFINITIONS",&(this->Moc).Defines);
      InfoWriter::
      WriteConfigStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_DEFINITIONS",&(this->Moc).ConfigDefines);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_INCLUDES",&(this->Moc).Includes);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_MOC_INCLUDES",&(this->Moc).ConfigIncludes);
      pcVar3 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e8,"AUTOMOC_MOC_OPTIONS",&local_7e9);
      pcVar5 = cmGeneratorTarget::GetSafeProperty(pcVar3,&local_7e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,pcVar5,&local_7ea);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_OPTIONS",&local_7c8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator(&local_7ea);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::allocator<char>::~allocator(&local_7e9);
      SetupWriteAutogenInfo()::$_0::operator()[abi_cxx11_
                (&local_810,&local_280,"CMAKE_AUTOMOC_RELAXED_MODE");
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_RELAXED_MODE",&local_810);
      std::__cxx11::string::~string((string *)&local_810);
      pcVar3 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,"AUTOMOC_MACRO_NAMES",&local_851);
      pcVar5 = cmGeneratorTarget::GetSafeProperty(pcVar3,&local_850);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,pcVar5,&local_852);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_MACRO_NAMES",&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      std::allocator<char>::~allocator(&local_852);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      pcVar3 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_898,"AUTOMOC_DEPEND_FILTERS",&local_899);
      pcVar5 = cmGeneratorTarget::GetSafeProperty(pcVar3,&local_898);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,pcVar5,&local_89a);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_DEPEND_FILTERS",&local_878);
      std::__cxx11::string::~string((string *)&local_878);
      std::allocator<char>::~allocator(&local_89a);
      std::__cxx11::string::~string((string *)&local_898);
      std::allocator<char>::~allocator(&local_899);
      InfoWriter::Write((InfoWriter *)local_260,"AM_MOC_PREDEFS_CMD",&(this->Moc).PredefsCmd);
    }
    if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
      this_01 = &(this->Uic).SkipUi;
      __first = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(this_01);
      err.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_01);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&headerCount,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__first._M_node,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )err.field_2._8_8_);
      InfoWriter::Write((InfoWriter *)local_260,"# UIC settings\n");
      InfoWriter::
      WriteStrings<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_SKIP",
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&headerCount);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_TARGET_OPTIONS",&(this->Uic).Options);
      InfoWriter::
      WriteConfigStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_TARGET_OPTIONS",&(this->Uic).ConfigOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_OPTIONS_FILES",&(this->Uic).FileFiles);
      InfoWriter::WriteNestedLists
                ((InfoWriter *)local_260,"AM_UIC_OPTIONS_OPTIONS",&(this->Uic).FileOptions);
      InfoWriter::
      WriteStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((InfoWriter *)local_260,"AM_UIC_SEARCH_PATHS",&(this->Uic).SearchPaths);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&headerCount);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&uic_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&moc_skip._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourcesFlags.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sources.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&headersBuildPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&headersFlags.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8d0,"AutoGen: Could not write file ",&local_8d1);
    std::allocator<char>::~allocator(&local_8d1);
    std::__cxx11::string::operator+=((string *)local_8d0,(string *)&(this->AutogenTarget).InfoFile);
    cmSystemTools::Error((string *)local_8d0);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_8d0);
  }
  InfoWriter::~InfoWriter((InfoWriter *)local_260);
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  InfoWriter ofs(this->AutogenTarget.InfoFile);
  if (ofs) {
    // Utility lambdas
    cmMakefile* makefile = this->Target->Target->GetMakefile();
    auto MfDef = [makefile](const char* key) {
      return makefile->GetSafeDefinition(key);
    };

    // Write common settings
    ofs.Write("# Meta\n");
    ofs.Write("AM_MULTI_CONFIG", this->MultiConfig ? "TRUE" : "FALSE");
    ofs.Write("AM_PARALLEL", this->AutogenTarget.Parallel);
    ofs.Write("AM_VERBOSITY", this->Verbosity);

    ofs.Write("# Directories\n");
    ofs.Write("AM_CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_SOURCE_DIR",
              MfDef("CMAKE_CURRENT_SOURCE_DIR"));
    ofs.Write("AM_CMAKE_CURRENT_BINARY_DIR",
              MfDef("CMAKE_CURRENT_BINARY_DIR"));
    ofs.Write("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",
              MfDef("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE"));
    ofs.Write("AM_BUILD_DIR", this->Dir.Build);
    ofs.Write("AM_INCLUDE_DIR", this->Dir.Include);
    ofs.WriteConfig("AM_INCLUDE_DIR", this->Dir.ConfigInclude);

    std::vector<std::string> headers;
    std::vector<std::string> headersFlags;
    std::vector<std::string> headersBuildPaths;
    std::vector<std::string> sources;
    std::vector<std::string> sourcesFlags;
    std::set<std::string> moc_skip;
    std::set<std::string> uic_skip;

    // Filter headers
    {
      auto headerCount = this->AutogenTarget.Headers.size();
      headers.reserve(headerCount);
      headersFlags.reserve(headerCount);

      std::vector<MUFile const*> sortedHeaders;
      {
        sortedHeaders.reserve(headerCount);
        for (auto const& pair : this->AutogenTarget.Headers) {
          sortedHeaders.emplace_back(pair.second.get());
        }
        std::sort(sortedHeaders.begin(), sortedHeaders.end(),
                  [](MUFile const* a, MUFile const* b) {
                    return (a->RealPath < b->RealPath);
                  });
      }

      for (MUFile const* const muf : sortedHeaders) {
        if (muf->Generated && !this->CMP0071Accept) {
          continue;
        }
        if (muf->SkipMoc) {
          moc_skip.insert(muf->RealPath);
        }
        if (muf->SkipUic) {
          uic_skip.insert(muf->RealPath);
        }
        if (muf->MocIt || muf->UicIt) {
          headers.emplace_back(muf->RealPath);
          std::string flags;
          flags += muf->MocIt ? 'M' : 'm';
          flags += muf->UicIt ? 'U' : 'u';
          headersFlags.emplace_back(std::move(flags));
        }
      }
    }
    // Header build paths
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      std::unordered_set<std::string> emitted;
      for (std::string const& hdr : headers) {
        std::string basePath = fpathCheckSum.getPart(hdr);
        basePath += "/moc_";
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(hdr);
        for (unsigned int ii = 1; ii != 1024; ++ii) {
          std::string path = basePath;
          if (ii > 1) {
            path += '_';
            path += std::to_string(ii);
          }
          path += ".cpp";
          if (emitted.emplace(path).second) {
            headersBuildPaths.emplace_back(std::move(path));
            break;
          }
        }
      }
    }

    // Filter sources
    {
      auto sourcesCount = this->AutogenTarget.Sources.size();
      sources.reserve(sourcesCount);
      sourcesFlags.reserve(sourcesCount);

      std::vector<MUFile const*> sorted;
      sorted.reserve(sourcesCount);
      for (auto const& pair : this->AutogenTarget.Sources) {
        sorted.emplace_back(pair.second.get());
      }
      std::sort(sorted.begin(), sorted.end(),
                [](MUFile const* a, MUFile const* b) {
                  return (a->RealPath < b->RealPath);
                });

      for (MUFile const* const muf : sorted) {
        if (muf->Generated && !this->CMP0071Accept) {
          continue;
        }
        if (muf->SkipMoc) {
          moc_skip.insert(muf->RealPath);
        }
        if (muf->SkipUic) {
          uic_skip.insert(muf->RealPath);
        }
        if (muf->MocIt || muf->UicIt) {
          sources.emplace_back(muf->RealPath);
          std::string flags;
          flags += muf->MocIt ? 'M' : 'm';
          flags += muf->UicIt ? 'U' : 'u';
          sourcesFlags.emplace_back(std::move(flags));
        }
      }
    }

    ofs.Write("# Qt\n");
    ofs.WriteUInt("AM_QT_VERSION_MAJOR", this->QtVersion.Major);
    ofs.Write("AM_QT_MOC_EXECUTABLE", this->Moc.Executable);
    ofs.Write("AM_QT_UIC_EXECUTABLE", this->Uic.Executable);

    ofs.Write("# Files\n");
    ofs.Write("AM_CMAKE_EXECUTABLE", cmSystemTools::GetCMakeCommand());
    ofs.Write("AM_SETTINGS_FILE", this->AutogenTarget.SettingsFile);
    ofs.WriteConfig("AM_SETTINGS_FILE",
                    this->AutogenTarget.ConfigSettingsFile);
    ofs.Write("AM_PARSE_CACHE_FILE", this->AutogenTarget.ParseCacheFile);
    ofs.WriteStrings("AM_HEADERS", headers);
    ofs.WriteStrings("AM_HEADERS_FLAGS", headersFlags);
    ofs.WriteStrings("AM_HEADERS_BUILD_PATHS", headersBuildPaths);
    ofs.WriteStrings("AM_SOURCES", sources);
    ofs.WriteStrings("AM_SOURCES_FLAGS", sourcesFlags);

    // Write moc settings
    if (this->Moc.Enabled) {
      ofs.Write("# MOC settings\n");
      ofs.WriteStrings("AM_MOC_SKIP", moc_skip);
      ofs.WriteStrings("AM_MOC_DEFINITIONS", this->Moc.Defines);
      ofs.WriteConfigStrings("AM_MOC_DEFINITIONS", this->Moc.ConfigDefines);
      ofs.WriteStrings("AM_MOC_INCLUDES", this->Moc.Includes);
      ofs.WriteConfigStrings("AM_MOC_INCLUDES", this->Moc.ConfigIncludes);
      ofs.Write("AM_MOC_OPTIONS",
                this->Target->GetSafeProperty("AUTOMOC_MOC_OPTIONS"));
      ofs.Write("AM_MOC_RELAXED_MODE", MfDef("CMAKE_AUTOMOC_RELAXED_MODE"));
      ofs.Write("AM_MOC_MACRO_NAMES",
                this->Target->GetSafeProperty("AUTOMOC_MACRO_NAMES"));
      ofs.Write("AM_MOC_DEPEND_FILTERS",
                this->Target->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
      ofs.Write("AM_MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    }

    // Write uic settings
    if (this->Uic.Enabled) {
      // Add skipped .ui files
      uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

      ofs.Write("# UIC settings\n");
      ofs.WriteStrings("AM_UIC_SKIP", uic_skip);
      ofs.WriteStrings("AM_UIC_TARGET_OPTIONS", this->Uic.Options);
      ofs.WriteConfigStrings("AM_UIC_TARGET_OPTIONS", this->Uic.ConfigOptions);
      ofs.WriteStrings("AM_UIC_OPTIONS_FILES", this->Uic.FileFiles);
      ofs.WriteNestedLists("AM_UIC_OPTIONS_OPTIONS", this->Uic.FileOptions);
      ofs.WriteStrings("AM_UIC_SEARCH_PATHS", this->Uic.SearchPaths);
    }
  } else {
    std::string err = "AutoGen: Could not write file ";
    err += this->AutogenTarget.InfoFile;
    cmSystemTools::Error(err);
    return false;
  }

  return true;
}